

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DoWhileStatementSyntax::getChild(DoWhileStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffff68);
    break;
  case 2:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4e9120,token);
    break;
  case 3:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0x68));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 4:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4e9170,token_00);
    break;
  case 5:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4e91a6,token_01);
    break;
  case 6:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 0x90));
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 7:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4e91fc,token_02);
    break;
  case 8:
    token_03.info = in_stack_ffffffffffffff70;
    token_03._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x4e922f,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax DoWhileStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return doKeyword;
        case 3: return statement.get();
        case 4: return whileKeyword;
        case 5: return openParen;
        case 6: return expr.get();
        case 7: return closeParen;
        case 8: return semi;
        default: return nullptr;
    }
}